

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall
iu_UtilTest_x_iutest_x_FindParamTypedTest_Test::Body
          (iu_UtilTest_x_iutest_x_FindParamTypedTest_Test *this)

{
  bool bVar1;
  int iVar2;
  UnitTest *pUVar3;
  char *pcVar4;
  ulong uVar5;
  TestSuite *pTVar6;
  uint uVar7;
  TestSuite *pTVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  AssertionResult iutest_ar;
  TestSuite *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  AssertionResult local_238;
  AssertionHelper local_210;
  undefined1 local_1e0 [432];
  
  pUVar3 = iutest::UnitTest::instance();
  pTVar6 = (TestSuite *)
           ((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                          super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                         super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)(uint)pTVar6) {
    pTVar6 = (TestSuite *)(ulong)((uint)pTVar6 & 0x7fffffff);
    pTVar8 = (TestSuite *)0x0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      pcVar4 = strchr(((pUVar3->super_UnitTestImpl).m_testsuites.
                       super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pTVar8]->m_testsuite_name).
                      _M_dataplus._M_p,0x2f);
      if (((pcVar4 == (char *)0x0) || (iVar2 = strncmp(pcVar4 + 1,"UnitTest",8), iVar2 != 0)) ||
         (pcVar4[9] != '/')) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    } while ((bVar1) &&
            (pTVar8 = (TestSuite *)((long)&pTVar8->_vptr_TestSuite + 1), pTVar6 != pTVar8));
  }
  iutest::internal::NullHelper<false>::CompareEq<iutest::TestSuite>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  if (local_238.m_result == false) {
    memset((iu_global_format_stringstream *)local_1e0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,local_238.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdc7);
    local_210.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_210.m_part_result.super_iuCodeMessage.m_line = 0x7e;
    local_210.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_210,(Fixed *)local_1e0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_210.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_210.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
    std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_message._M_dataplus._M_p != &local_238.m_message.field_2) {
    operator_delete(local_238.m_message._M_dataplus._M_p,
                    local_238.m_message.field_2._M_allocated_capacity + 1);
  }
  pUVar3 = iutest::UnitTest::instance();
  uVar7 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar7 < 1) {
    pTVar6 = (TestSuite *)0x0;
  }
  else {
    uVar5 = 0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      pTVar8 = (pUVar3->super_UnitTestImpl).m_testsuites.
               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar5];
      pcVar4 = strchr((pTVar8->m_testsuite_name)._M_dataplus._M_p,0x2f);
      if (((pcVar4 == (char *)0x0) || (iVar2 = strncmp(pcVar4 + 1,"TypeParamTest",0xd), iVar2 != 0))
         || (pcVar4[0xe] != '/')) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
        pTVar6 = pTVar8;
      }
      if (!bVar1) goto LAB_00134e77;
      uVar5 = uVar5 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar5);
    pTVar6 = (TestSuite *)0x0;
  }
LAB_00134e77:
  paVar9 = &local_238.m_message.field_2;
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestSuite>
            (&local_238,"(find_testsuite)",pTVar6);
  if (local_238.m_result == false) {
    memset((iu_global_format_stringstream *)local_1e0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,local_238.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdc7);
    local_210.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_210.m_part_result.super_iuCodeMessage.m_line = 0x82;
    local_210.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_210,(Fixed *)local_1e0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_210.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_210.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
    std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_message._M_dataplus._M_p != paVar9) {
    operator_delete(local_238.m_message._M_dataplus._M_p,
                    local_238.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar6 = iuutil::FindParamTypedTestSuite("TypeParamTest",pTVar6);
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestSuite>
            (&local_238,"(find_testsuite)",pTVar6);
  if (local_238.m_result == false) {
    memset((iu_global_format_stringstream *)local_1e0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,local_238.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdc7);
    local_210.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_210.m_part_result.super_iuCodeMessage.m_line = 0x84;
    local_210.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_210,(Fixed *)local_1e0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_210.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_210.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
    std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_message._M_dataplus._M_p != paVar9) {
    operator_delete(local_238.m_message._M_dataplus._M_p,
                    local_238.m_message.field_2._M_allocated_capacity + 1);
  }
  iuutil::FindParamTypedTestSuite("TypeParamTest",pTVar6);
  iutest::internal::NullHelper<false>::CompareEq<iutest::TestSuite>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  if (local_238.m_result == false) {
    memset((iu_global_format_stringstream *)local_1e0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,local_238.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdc7);
    local_210.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_210.m_part_result.super_iuCodeMessage.m_line = 0x86;
    local_210.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_210,(Fixed *)local_1e0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_210.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_210.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
    std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_message._M_dataplus._M_p != paVar9) {
    operator_delete(local_238.m_message._M_dataplus._M_p,
                    local_238.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_P(ParamTest, Test)
{
}